

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void * xemmai::t_heap<xemmai::t_object>::f_map(size_t a_n)

{
  void *pvVar1;
  _Link_type __z;
  iterator __x;
  undefined8 *extraout_RDX;
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  *this;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar2;
  
  this = (_Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          *)0x0;
  pvVar1 = mmap((void *)0x0,a_n,3,0x22,-1,0);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    return pvVar1;
  }
  xemmai::portable::f_throw_system_error();
  __z = (_Link_type)operator_new(0x30);
  *(undefined8 *)(__z->_M_storage)._M_storage = *(undefined8 *)a_n;
  *(undefined8 *)((__z->_M_storage)._M_storage + 8) = *extraout_RDX;
  pVar2 = std::
          _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          ::_M_get_insert_unique_pos(this,(key_type *)&__z->_M_storage);
  __x._M_node = pVar2.first;
  if (pVar2.second == (_Base_ptr)0x0) {
    operator_delete(__z,0x30);
  }
  else {
    __x = std::
          _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
          ::_M_insert_node(this,__x._M_node,pVar2.second,__z);
  }
  return __x._M_node;
}

Assistant:

static void* f_map(size_t a_n)
	{
#ifdef __unix__
		auto p = mmap(NULL, a_n, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
		if (p == MAP_FAILED) portable::f_throw_system_error();
#endif
#ifdef _WIN32
		auto p = VirtualAlloc(NULL, a_n, MEM_COMMIT | MEM_RESERVE, PAGE_READWRITE);
		if (p == NULL) throw std::system_error(GetLastError(), std::system_category());
#endif
		return p;
	}